

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

uint32_t ranged_random(uint32_t range)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = pcg32_random();
  uVar2 = (ulong)uVar1;
  if ((range & range - 1) == 0) {
    uVar1 = uVar1 & range - 1;
  }
  else {
    uVar4 = (ulong)range;
    if (range < 0x80000001) {
      lVar3 = uVar2 * uVar4;
      if ((uint)lVar3 < range) {
        while ((uint)lVar3 <= (uint)(0xffffffff % (ulong)range)) {
          uVar1 = pcg32_random();
          lVar3 = uVar1 * uVar4;
        }
      }
      uVar1 = (uint32_t)((ulong)lVar3 >> 0x20);
    }
    else {
      while (uVar1 = (uint32_t)uVar2, uVar4 <= uVar2) {
        uVar1 = pcg32_random();
        uVar2 = (ulong)uVar1;
      }
    }
  }
  return uVar1;
}

Assistant:

static inline uint32_t ranged_random(uint32_t range) {
    uint64_t random32bit, multiresult;
    uint32_t leftover;
    uint32_t threshold;
    random32bit = pcg32_random();
    if ((range & (range - 1)) == 0) {
        return random32bit & (range - 1);
    }
    if (range > 0x80000000) {  // if range > 1<<31
        while (random32bit >= range) {
            random32bit = pcg32_random();
        }
        return (uint32_t)random32bit;  // [0, range)
    }
    multiresult = random32bit * range;
    leftover = (uint32_t)multiresult;
    if (leftover < range) {
        threshold = 0xFFFFFFFF % range;
        while (leftover <= threshold) {
            random32bit = pcg32_random();
            multiresult = random32bit * range;
            leftover = (uint32_t)multiresult;
        }
    }
    return multiresult >> 32;  // [0, range)
}